

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_string_cmp(mbedtls_x509_buf *a,mbedtls_x509_buf *b)

{
  int iVar1;
  mbedtls_x509_buf *b_local;
  mbedtls_x509_buf *a_local;
  
  if (((a->tag == b->tag) && (a->len == b->len)) && (iVar1 = memcmp(a->p,b->p,b->len), iVar1 == 0))
  {
    return 0;
  }
  if ((((a->tag == 0xc) || (a->tag == 0x13)) && ((b->tag == 0xc || (b->tag == 0x13)))) &&
     ((a->len == b->len && (iVar1 = x509_memcasecmp(a->p,b->p,b->len), iVar1 == 0)))) {
    return 0;
  }
  return -1;
}

Assistant:

static int x509_string_cmp( const mbedtls_x509_buf *a, const mbedtls_x509_buf *b )
{
    if( a->tag == b->tag &&
        a->len == b->len &&
        memcmp( a->p, b->p, b->len ) == 0 )
    {
        return( 0 );
    }

    if( ( a->tag == MBEDTLS_ASN1_UTF8_STRING || a->tag == MBEDTLS_ASN1_PRINTABLE_STRING ) &&
        ( b->tag == MBEDTLS_ASN1_UTF8_STRING || b->tag == MBEDTLS_ASN1_PRINTABLE_STRING ) &&
        a->len == b->len &&
        x509_memcasecmp( a->p, b->p, b->len ) == 0 )
    {
        return( 0 );
    }

    return( -1 );
}